

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O0

string * duckdb_apache::thrift::to_string<signed_char>(char *t)

{
  char *in_RSI;
  string *in_RDI;
  ostringstream o;
  ostringstream local_188 [376];
  char *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::operator<<(local_188,(int)*local_10);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string to_string(const T& t) {
  std::ostringstream o;
  o << t;
  return o.str();
}